

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_gettable(lua_State *L,int idx)

{
  long lVar1;
  TValue *t_00;
  bool bVar2;
  TValue *io2;
  TValue *io1;
  TValue *t;
  TValue *slot;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2value(L,idx);
  if (t_00->tt_ == 'E') {
    t = luaH_get((Table *)(t_00->value_).gc,(TValue *)((L->top).offset + -0x10));
    bVar2 = (t->tt_ & 0xf) != 0;
  }
  else {
    t = (TValue *)0x0;
    bVar2 = false;
  }
  if (bVar2) {
    lVar1 = (L->top).offset;
    *(Value *)(lVar1 + -0x10) = t->value_;
    *(lu_byte *)(lVar1 + -8) = t->tt_;
  }
  else {
    luaV_finishget(L,t_00,(TValue *)((L->top).offset + -0x10),(StkId)((L->top).offset + -0x10),t);
  }
  return *(byte *)((L->top).offset + -8) & 0xf;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  const TValue *slot;
  TValue *t;
  lua_lock(L);
  t = index2value(L, idx);
  if (luaV_fastget(L, t, s2v(L->top.p - 1), slot, luaH_get)) {
    setobj2s(L, L->top.p - 1, slot);
  }
  else
    luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, slot);
  lua_unlock(L);
  return ttype(s2v(L->top.p - 1));
}